

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O3

LTFlightData * __thiscall ACTable::build(ACTable *this,string *_filter,int _x,int _y)

{
  undefined1 uVar1;
  pointer pcVar2;
  LTAircraft *pLVar3;
  bool bVar4;
  ImU32 col_00;
  ImU32 col_01;
  ImGuiTableSortSpecs *pIVar5;
  iterator iVar6;
  ACIWnd *pAVar7;
  ImGuiContext *ctx;
  ImGuiTableSortSpecsColumn *pIVar8;
  pointer __k;
  ImGuiTableColumnFlags *pIVar9;
  AlignTy *pAVar10;
  string *psVar11;
  string *s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ImGuiID col;
  long lVar13;
  ImVec2 IVar14;
  bool bAutoVisible;
  ImVec2 selSize;
  string url;
  ImVec2 tblSize;
  bool local_9a;
  bool local_99;
  LTAircraft *local_98;
  ImVec2 local_90;
  string local_88;
  ImVec2 local_68;
  string local_60;
  _Base_ptr local_40;
  pointer local_38;
  
  IVar14 = ImGui::GetContentRegionAvail();
  local_68.x = (float)_x;
  if (_x < 1) {
    local_68.x = local_68.x + IVar14.x;
  }
  local_68.y = (float)_y;
  if (_y < 1) {
    local_68.y = IVar14.y + local_68.y;
  }
  bVar4 = ImGui::BeginTable("ACList",0x27,0x170804f,&local_68,0.0);
  if (!bVar4) {
    return (LTFlightData *)0x0;
  }
  pIVar9 = &gCols._M_elems[0].colFlags;
  lVar13 = 0;
  do {
    ImGui::TableSetupColumn
              ((((ACTColDefTy *)(pIVar9 + -10))->colName)._M_dataplus._M_p,*pIVar9 | 0x800,
               (float)pIVar9[-2],(ImGuiID)lVar13);
    lVar13 = lVar13 + 1;
    pIVar9 = pIVar9 + 0xc;
  } while (lVar13 != 0x27);
  ImGui::TableAutoHeaders();
  bVar4 = UpdateFDIs(this,_filter);
  pIVar5 = ImGui::TableGetSortSpecs();
  if (bVar4) {
    pIVar8 = pIVar5->Specs;
  }
  else if ((((pIVar5 == (ImGuiTableSortSpecs *)0x0) || (pIVar5->SpecsChanged != true)) ||
           (pIVar8 = pIVar5->Specs, pIVar8 == (ImGuiTableSortSpecsColumn *)0x0)) ||
          ((pIVar5->SpecsCount < 1 ||
           ((ulong)(((long)(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 4) * 0x2fd2fd2fd2fd2fd3) < 2)
           ))) goto LAB_0012384a;
  Sort(this,*(ACTColumnsTy *)pIVar8,pIVar8[6] == (ImGuiTableSortSpecsColumn)0x1);
LAB_0012384a:
  __k = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_38 = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (__k != local_38) {
    psVar11 = (__k->v)._M_elems;
    local_40 = &mapFd._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      ImGui::TableNextRow(0,0.0);
      pAVar10 = &gCols._M_elems[0].colAlign;
      lVar13 = 0;
      s = psVar11;
      do {
        if (((lVar13 != 0xe) && (lVar13 != 0x26)) &&
           (bVar4 = ImGui::TableSetColumnIndex((int)lVar13), bVar4)) {
          ImGui::TextAligned(*pAVar10,s);
        }
        lVar13 = lVar13 + 1;
        s = s + 1;
        pAVar10 = pAVar10 + 0xc;
      } while (lVar13 != 0x27);
      ImGui::PushID((__k->key).key._M_dataplus._M_p);
      col_00 = ImGui::GetColorU32(0x18,1.0);
      col_01 = ImGui::GetColorU32(0x19,1.0);
      ImGui::PushStyleColor(0x18,col_01);
      ImGui::PushStyleColor(0x19,col_00);
      local_90.x = ImGui::GetWidthIconBtn(false);
      local_90.y = 0.0;
      iVar6 = std::
              _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
              ::find(&mapFd._M_t,&__k->key);
      if (iVar6._M_node == local_40) {
        local_98 = (LTAircraft *)0x0;
      }
      else {
        local_98 = (LTAircraft *)iVar6._M_node[0x1d]._M_left;
      }
      paVar12 = &local_88.field_2;
      bVar4 = ImGui::TableSetColumnIndex(0xe);
      if (bVar4) {
        bVar4 = ImGui::SelectableTooltip
                          (anon_var_dwarf_1fbb4,false,(__k->key).eKeyType == KEY_ICAO,
                           "Update aircraft profile at OpenSky",0,&local_90);
        if (bVar4) {
          local_88._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"https://opensky-network.org/aircraft-profile?icao24=","");
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          pcVar2 = (__k->key).key._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar2,pcVar2 + (__k->key).key._M_string_length);
          LTOpenURL(&local_88,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar12) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        ImGui::SameLine(0.0,-1.0);
        bVar4 = ImGui::SelectableTooltip
                          (anon_var_dwarf_1fbfc,false,(__k->v)._M_elems[10]._M_string_length != 0,
                           "Update flight/route at OpenSky",0,&local_90);
        if (bVar4) {
          local_88._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"https://opensky-network.org/add-route?callsign=","");
          LTOpenURL(&local_88,(__k->v)._M_elems + 10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar12) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      bVar4 = ImGui::TableSetColumnIndex(0x26);
      if (bVar4) {
        local_99 = false;
        if (local_98 == (LTAircraft *)0x0) {
          local_9a = false;
        }
        else {
          local_99 = (bool)0;
          if ((local_98->super_Aircraft).bVisible != false) {
            uVar1 = (local_98->super_Aircraft).bValid;
            local_99 = (bool)uVar1;
          }
          local_9a = local_98->bAutoVisible;
        }
        pAVar7 = ACIWnd::GetWnd(&__k->key);
        bVar4 = ImGui::SelectableTooltip
                          (anon_var_dwarf_1fc44,pAVar7 != (ACIWnd *)0x0,true,
                           "Open Aircraft Info Window",0,&local_90);
        if (bVar4) {
          ctx = ImGui::GetCurrentContext();
          if (pAVar7 == (ACIWnd *)0x0) {
            pcVar2 = (__k->key).key._M_dataplus._M_p;
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar2,pcVar2 + (__k->key).key._M_string_length);
            ACIWnd::OpenNewWnd(&local_88,WND_MODE_FLOAT_CNT_VR);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            (*(pAVar7->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])(pAVar7);
          }
          ImGui::SetCurrentContext(ctx);
        }
        pLVar3 = local_98;
        paVar12 = &local_88.field_2;
        bVar4 = local_98 != (LTAircraft *)0x0;
        ImGui::SameLine(0.0,-1.0);
        bVar4 = ImGui::SelectableTooltip
                          (anon_var_dwarf_1fc74,LTAircraft::pExtViewAc == pLVar3 && bVar4,bVar4,
                           "Toggle camera view",0,&local_90);
        if (bVar4) {
          LTAircraft::ToggleCameraView(local_98);
        }
        ImGui::SameLine(0.0,-1.0);
        local_88._M_dataplus._M_p = (pointer)paVar12;
        if (iVar6._M_node == local_40) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,iVar6._M_node[0x1a]._M_parent,
                     (long)&(iVar6._M_node[0x1a]._M_left)->_M_color +
                     (long)iVar6._M_node[0x1a]._M_parent);
        }
        bVar4 = ImGui::SelectableTooltip
                          (anon_var_dwarf_4fc7,false,local_88._M_string_length != 0,
                           "Open flight in browser",0,&local_90);
        if (bVar4) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
          LTOpenURL(&local_88,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        ImGui::SameLine(0.0,-1.0);
        bVar4 = ImGui::SelectableTooltip
                          (anon_var_dwarf_1fce0,&local_99,local_98 != (LTAircraft *)0x0,
                           "Toggle aircraft\'s visibility",0,&local_90);
        if (bVar4) {
          (*(local_98->super_Aircraft)._vptr_Aircraft[4])(local_98,(ulong)local_99);
        }
        if ((dataRefs.hideStaticTwr != 0) || (bVar4 = DataRefs::WarnAutoHiding(&dataRefs), bVar4)) {
          ImGui::SameLine(0.0,-1.0);
          bVar4 = ImGui::SelectableTooltip
                            (anon_var_dwarf_1fd04,&local_9a,local_98 != (LTAircraft *)0x0,
                             "Toggle aircraft\'s auto visibility",0,&local_90);
          if (bVar4) {
            LTAircraft::SetAutoVisible(local_98,local_9a);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar12) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      ImGui::PopStyleColor(2);
      ImGui::PopID();
      __k = __k + 1;
      psVar11 = (string *)&psVar11[0x2d].field_2;
    } while (__k != local_38);
  }
  ImGui::EndTable();
  return (LTFlightData *)0x0;
}

Assistant:

LTFlightData* ACTable::build (const std::string& _filter, int _x, int _y)
{
    // return value: the just selected aircraft, if any
    LTFlightData* pSelFD = nullptr;
    
    // Determine size, basis is the available content region
    ImVec2 tblSize = ImGui::GetContentRegionAvail();
    if (_x <= 0) tblSize.x += float(_x);    // Determine width
    else tblSize.x = float(_x);
    if (_y <= 0) tblSize.y += float(_y);    // Determine height
    else tblSize.y = float(_y);
    
    // Start drawing the table
    if (ImGui::BeginTable("ACList", ACT_COL_COUNT,
                          ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable |
                          ImGuiTableFlags_Hideable | ImGuiTableFlags_Sortable |
                          ImGuiTableFlags_RowBg |
                          ImGuiTableFlags_SizingPolicyFixedX | ImGuiTableFlags_Scroll |
                          ImGuiTableFlags_ScrollFreezeTopRow |
                          ImGuiTableFlags_ScrollFreezeLeftColumn,
                          tblSize))
    {
        // Set up the columns
        for (ImGuiID col = 0; col < ACT_COL_COUNT; ++col) {
            const ACTColDefTy& colDef = gCols[col];
            ImGui::TableSetupColumn(colDef.colName.c_str(),
                                    colDef.colFlags | ImGuiTableColumnFlags_NoHeaderWidth,
                                    colDef.colWidth,
                                    col);       // use ACTColumnsTy as ColumnUserID
        }
        ImGui::TableAutoHeaders();

        // Set up a/c list
        bool bUpdated = UpdateFDIs(_filter);

        // Sort the data if and as needed
        const ImGuiTableSortSpecs* sortSpecs = ImGui::TableGetSortSpecs();
        if (bUpdated ||
            (sortSpecs && sortSpecs->SpecsChanged &&
             sortSpecs->Specs && sortSpecs->SpecsCount >= 1 &&
             vecFDI.size() > 1))
        {
            // We sort only by one column, no multi-column sort yet
            const ImGuiTableSortSpecsColumn& colSpec = *(sortSpecs->Specs);
            Sort((ACTColumnsTy)colSpec.ColumnUserID,
                 colSpec.SortDirection == ImGuiSortDirection_Ascending);
        }
        
        // Fill the data into the list
        for (const FDInfo& fdi: vecFDI) {
            ImGui::TableNextRow();
            for (size_t col = 0; col < ACT_COL_COUNT; ++col) {
                switch (col) {
                    // There are a few columns with special treatment,
                    case ACT_COL_UPDATE:
                    case ACT_COL_ACTIONS:
                        continue;
                     // the others are just to be drawn
                    default:
                        if (ImGui::TableSetColumnIndex(int(col))) {
                            ImGui::TextAligned(gCols[col].colAlign, fdi.v[col]);
                        }
                }
            }
            
            // --- prepare for columns with action buttons ---
            
            // Make sure all the buttons have a unique id
            ImGui::PushID(fdi.key.c_str());
            
            // Make selected buttons more visible: Exchange Hovered (lighter) and std color (darker)
            const ImU32 colHeader = ImGui::GetColorU32(ImGuiCol_Header);
            ImGui::PushStyleColor(ImGuiCol_Header,          ImGui::GetColorU32(ImGuiCol_HeaderHovered));
            ImGui::PushStyleColor(ImGuiCol_HeaderHovered,   colHeader);
            
            // Limit the width of the selectables
            ImVec2 selSize (ImGui::GetWidthIconBtn(), 0.0f);
            
            // (Potential) access to the aircraft, can be `nullptr`!
            LTFlightData* pFD = fdi.GetFD();
            LTAircraft* pAc = pFD ? pFD->GetAircraft() : nullptr;
            
            // Update columnd
            if (ImGui::TableSetColumnIndex(ACT_COL_UPDATE)) {
                // Aircraft Profile update (if there is an ICAO key)
                if (ImGui::SelectableTooltip(ICON_FA_PLANE "##AircraftProfile",
                                             false,                                         // selected?
                                             fdi.key.eKeyType == LTFlightData::KEY_ICAO,    // enabled?
                                             "Update aircraft profile at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_AC, fdi.key);
                
                // Route update (if there is a call sign)
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_ROUTE "##Route",
                                             false,                                         // selected?
                                             !fdi.v[ACT_COL_CALLSIGN].empty(),              // enabled?
                                             "Update flight/route at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_ROUTE, fdi.v[ACT_COL_CALLSIGN]);
            }

            // Action column
            if (ImGui::TableSetColumnIndex(ACT_COL_ACTIONS)) {
                // Is a/c visible/auto-visible?
                bool bVisible       = pAc ? pAc->IsVisible()        : false;
                bool bAutoVisible   = pAc ? pAc->IsAutoVisible()    : false;

                // Open a/c info window
                ACIWnd* pACIWnd = ACIWnd::GetWnd(fdi.key);
                if (ImGui::SelectableTooltip(ICON_FA_INFO_CIRCLE "##ACIWnd",
                                             pACIWnd != nullptr, true,              // selected?, enabled!
                                             "Open Aircraft Info Window",
                                             ImGuiSelectableFlags_None, selSize))
                {
                    // Toggle a/c info wnd (safe/restore our context as we are now dealing with another ImGui window,
                    // which can mess up context pointers)
                    ImGuiContext* pCtxt = ImGui::GetCurrentContext();
                    if (pACIWnd) {
                        delete pACIWnd;
                        pACIWnd = nullptr;
                    } else {
                        ACIWnd::OpenNewWnd(fdi.key);
                    }
                    ImGui::SetCurrentContext(pCtxt);

                    // Open an ACIWnd, which is another ImGui window, so safe/restore our context
                }

                // Camera view
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_CAMERA "##CameraView",
                                             pAc ? pAc->IsInCameraView() : false,   // selected?
                                             pAc != nullptr,                        // enabled?
                                             "Toggle camera view",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->ToggleCameraView();

                // Link to browser for following the flight
                ImGui::SameLine();
                const std::string url (pFD ? pFD->GetUnsafeStat().slug : "");
                if (ImGui::SelectableTooltip(ICON_FA_EXTERNAL_LINK_SQUARE_ALT "##FlightURL",
                                             false,                                 // selected?
                                             !url.empty(),                          // enabled?
                                             "Open flight in browser",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(url);
                
                // Visible
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_EYE "##Visible", &bVisible,
                                             pAc != nullptr,      // enabled/disabled?
                                             "Toggle aircraft's visibility",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->SetVisible(bVisible);

                // "Auto Visible" only if some auto-hiding option is on
                if (dataRefs.IsAutoHidingActive()) {
                    ImGui::SameLine();
                    if (ImGui::SelectableTooltip(ICON_FA_EYE "##AutoVisible", &bAutoVisible,
                                                 pAc != nullptr,  // enabled/disabled
                                                 "Toggle aircraft's auto visibility",
                                                 ImGuiSelectableFlags_None, selSize))
                        pAc->SetAutoVisible(bAutoVisible);
                }
            } // action column

            // Restore styles
            ImGui::PopStyleColor(2);
            ImGui::PopID();

        }   // for all a/c rows
        
        // End of aircraft list
        ImGui::EndTable();
    }
    
    // return value: the just selected aircraft, if any
    return pSelFD;
}